

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall
semver::detail::lexer::scan_tokens(lexer *this,token_stream *token_stream)

{
  ulong uVar1;
  from_chars_result fVar3;
  token local_28;
  char *pcVar2;
  
  pcVar2 = (this->text_)._M_str;
  do {
    uVar1 = (this->text_)._M_len;
    if (uVar1 <= this->current_pos_) {
      local_28.type = eol;
      local_28.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
             (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
              )0x0;
      local_28.lexeme = (this->text_)._M_str + uVar1;
      detail::token_stream::push(token_stream,&local_28);
      fVar3._8_8_ = 0;
      fVar3.ptr = pcVar2;
      return (from_chars_result)fVar3;
    }
    fVar3 = (from_chars_result)scan_token(this,token_stream);
    pcVar2 = fVar3.ptr;
  } while (fVar3.ec == 0);
  return (from_chars_result)fVar3;
}

Assistant:

scan_tokens(token_stream& token_stream) noexcept {
    from_chars_result result{ text_.data(), std::errc{} };

    while (!is_eol()) {
      result = scan_token(token_stream);
      if (!result) {
        return result;
      }
    }

    token_stream.push({ token_type::eol, {}, text_.data() + text_.size() });

    return result;
  }